

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O3

void __thiscall
btDiscreteDynamicsWorld::integrateTransforms(btDiscreteDynamicsWorld *this,btScalar timeStep)

{
  btTransform *convexFromWorld;
  undefined8 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  btBroadphaseProxy *pbVar4;
  btPersistentManifold *pbVar5;
  bool bVar6;
  ConvexResultCallback CVar7;
  int iVar8;
  undefined4 extraout_var;
  btRigidBody *this_00;
  btRigidBody *pbVar9;
  btVector3 *pbVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  btScalar bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  btTransform predictedTrans;
  btVector3 imp;
  btSphereShape tmpSphere;
  btTransform modifiedPredictedTrans;
  btTransform local_188;
  ConvexResultCallback local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_f8;
  btRigidBody *local_f0;
  btScalar local_e8;
  undefined8 local_e0;
  btDispatcher *local_d8;
  btVector3 local_d0;
  undefined1 local_c0 [2] [16];
  btScalar local_94;
  btScalar local_84;
  btTransform local_78;
  
  CProfileManager::Start_Profile("integrateTransforms");
  if (0 < (this->m_nonStaticRigidBodies).m_size) {
    lVar12 = 0;
    do {
      pbVar9 = (this->m_nonStaticRigidBodies).m_data[lVar12];
      (pbVar9->super_btCollisionObject).m_hitFraction = 1.0;
      iVar8 = (pbVar9->super_btCollisionObject).m_activationState1;
      if (((iVar8 != 2) && (iVar8 != 5)) &&
         (((pbVar9->super_btCollisionObject).m_collisionFlags & 3) == 0)) {
        btRigidBody::predictIntegratedTransform(pbVar9,timeStep,&local_188);
        if ((this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatchInfo.m_useContinuous ==
            true) {
          fVar13 = (pbVar9->super_btCollisionObject).m_ccdMotionThreshold;
          fVar13 = fVar13 * fVar13;
          if (((fVar13 != 0.0) || (NAN(fVar13))) &&
             (fVar15 = local_188.m_origin.m_floats[2] -
                       (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2],
             fVar16 = local_188.m_origin.m_floats[0] -
                      (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0],
             fVar17 = local_188.m_origin.m_floats[1] -
                      (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1],
             fVar13 < fVar15 * fVar15 + fVar16 * fVar16 + fVar17 * fVar17)) {
            CProfileManager::Start_Profile("CCD motion clamping");
            bVar6 = true;
            if (((pbVar9->super_btCollisionObject).m_collisionShape)->m_shapeType < 0x14) {
              gNumClampedCcdMotions = gNumClampedCcdMotions + 1;
              iVar8 = (*((this->super_btDynamicsWorld).super_btCollisionWorld.m_broadphasePairCache)
                        ->_vptr_btBroadphaseInterface[9])();
              local_e0 = CONCAT44(extraout_var,iVar8);
              local_d8 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatcher1;
              local_138 = *(undefined8 *)
                           (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
              uStack_130 = *(undefined8 *)
                            ((pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats +
                            2);
              local_f8 = 0;
              local_148.m_closestHitFraction = 1.0;
              local_148.m_collisionFilterGroup = 1;
              local_148.m_collisionFilterMask = -1;
              local_148._vptr_ConvexResultCallback =
                   (_func_int **)&PTR__ConvexResultCallback_00220af0;
              local_e8 = 0.0;
              bVar14 = (pbVar9->super_btCollisionObject).m_ccdSweptSphereRadius;
              local_f0 = pbVar9;
              btConvexInternalShape::btConvexInternalShape((btConvexInternalShape *)local_c0);
              CVar7 = local_148;
              convexFromWorld = &(pbVar9->super_btCollisionObject).m_worldTransform;
              local_c0[0]._8_4_ = 8;
              local_c0[0]._0_8_ = &PTR__btConvexShape_0021e930;
              local_e8 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatchInfo.
                         m_allowedCcdPenetration;
              pbVar4 = (pbVar9->super_btCollisionObject).m_broadphaseHandle;
              uVar2 = pbVar4->m_collisionFilterGroup;
              uVar3 = pbVar4->m_collisionFilterMask;
              local_148.m_collisionFilterMask = uVar3;
              local_148.m_collisionFilterGroup = uVar2;
              local_148._0_12_ = CVar7._0_12_;
              local_78.m_basis.m_el[0].m_floats = *&(convexFromWorld->m_basis).m_el[0].m_floats;
              local_78.m_basis.m_el[1].m_floats._0_8_ =
                   *(undefined8 *)
                    (pbVar9->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
              local_78.m_basis.m_el[1].m_floats._8_8_ =
                   *(undefined8 *)
                    ((pbVar9->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2
                    );
              local_78.m_basis.m_el[2].m_floats._0_8_ =
                   *(undefined8 *)
                    (pbVar9->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
              local_78.m_basis.m_el[2].m_floats._8_8_ =
                   *(undefined8 *)
                    ((pbVar9->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2
                    );
              local_94 = bVar14;
              local_84 = bVar14;
              btCollisionWorld::convexSweepTest
                        ((btCollisionWorld *)this,(btConvexShape *)local_c0,convexFromWorld,
                         &local_78,&local_148,0.0);
              bVar6 = 1.0 <= local_148.m_closestHitFraction;
              if (bVar6) {
                btConvexShape::~btConvexShape((btConvexShape *)local_c0);
              }
              else {
                (pbVar9->super_btCollisionObject).m_hitFraction = local_148.m_closestHitFraction;
                btRigidBody::predictIntegratedTransform
                          (pbVar9,local_148.m_closestHitFraction * timeStep,&local_188);
                (pbVar9->super_btCollisionObject).m_hitFraction = 0.0;
                btRigidBody::proceedToTransform(pbVar9,&local_188);
                btConvexShape::~btConvexShape((btConvexShape *)local_c0);
              }
            }
            CProfileManager::Stop_Profile();
            if (!bVar6) goto LAB_001a8eec;
          }
        }
        btRigidBody::proceedToTransform(pbVar9,&local_188);
      }
LAB_001a8eec:
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->m_nonStaticRigidBodies).m_size);
  }
  if (this->m_applySpeculativeContactRestitution != false) {
    CProfileManager::Start_Profile("apply speculative contact restitution");
    iVar8 = (this->m_predictiveManifolds).m_size;
    if (0 < iVar8) {
      lVar12 = 0;
      do {
        pbVar5 = (this->m_predictiveManifolds).m_data[lVar12];
        pbVar9 = (btRigidBody *)pbVar5->m_body0;
        this_00 = (btRigidBody *)pbVar5->m_body1;
        if (((pbVar9->super_btCollisionObject).m_internalType & 2) == 0) {
          pbVar9 = (btRigidBody *)0x0;
        }
        if (((this_00->super_btCollisionObject).m_internalType & 2) == 0) {
          this_00 = (btRigidBody *)0x0;
        }
        if (0 < pbVar5->m_cachedPoints) {
          pbVar10 = &pbVar5->m_pointCache[0].m_positionWorldOnB;
          lVar11 = 0;
          do {
            bVar14 = btManifoldResult::calculateCombinedRestitution
                               (&pbVar9->super_btCollisionObject,&this_00->super_btCollisionObject);
            if (0.0 < bVar14) {
              fVar13 = *(btScalar *)((long)(pbVar10 + 5) + 0xc);
              if ((fVar13 != 0.0) || (NAN(fVar13))) {
                local_148._vptr_ConvexResultCallback._4_4_ =
                     bVar14 * fVar13 * -(float)((ulong)*(undefined8 *)pbVar10[2].m_floats >> 0x20);
                local_148._vptr_ConvexResultCallback._0_4_ =
                     bVar14 * fVar13 * -(float)*(undefined8 *)pbVar10[2].m_floats;
                local_148.m_closestHitFraction = -pbVar10[2].m_floats[2] * fVar13 * bVar14;
                local_148.m_collisionFilterGroup = 0;
                local_148.m_collisionFilterMask = 0;
                uVar1 = *(undefined8 *)
                         (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
                local_c0[0]._4_4_ =
                     (float)((ulong)*(undefined8 *)pbVar10[1].m_floats >> 0x20) -
                     (float)((ulong)uVar1 >> 0x20);
                local_c0[0]._0_4_ = (float)*(undefined8 *)pbVar10[1].m_floats - (float)uVar1;
                local_c0[0]._8_4_ =
                     pbVar10[1].m_floats[2] -
                     (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
                local_c0[0]._12_4_ = 0.0;
                uVar1 = *(undefined8 *)
                         (this_00->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
                local_78.m_basis.m_el[0].m_floats[1] =
                     (float)((ulong)*(undefined8 *)pbVar10->m_floats >> 0x20) -
                     (float)((ulong)uVar1 >> 0x20);
                local_78.m_basis.m_el[0].m_floats[0] =
                     (float)*(undefined8 *)pbVar10->m_floats - (float)uVar1;
                local_78.m_basis.m_el[0].m_floats[2] =
                     pbVar10->m_floats[2] -
                     (this_00->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
                local_78.m_basis.m_el[0].m_floats[3] = 0.0;
                btRigidBody::applyImpulse(pbVar9,(btVector3 *)&local_148,(btVector3 *)local_c0);
                local_d0.m_floats[2] = -local_148.m_closestHitFraction;
                local_d0.m_floats[0] =
                     (btScalar)
                     (int)((ulong)local_148._vptr_ConvexResultCallback ^ 0x8000000080000000);
                local_d0.m_floats[1] =
                     (btScalar)
                     (int)(((ulong)local_148._vptr_ConvexResultCallback ^ 0x8000000080000000) >>
                          0x20);
                local_d0.m_floats[3] = 0.0;
                btRigidBody::applyImpulse(this_00,&local_d0,(btVector3 *)&local_78);
              }
            }
            lVar11 = lVar11 + 1;
            pbVar10 = pbVar10 + 0xc;
          } while (lVar11 < pbVar5->m_cachedPoints);
          iVar8 = (this->m_predictiveManifolds).m_size;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar8);
    }
    CProfileManager::Stop_Profile();
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btDiscreteDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	BT_PROFILE("integrateTransforms");
	btTransform predictedTrans;
	for ( int i=0;i<m_nonStaticRigidBodies.size();i++)
	{
		btRigidBody* body = m_nonStaticRigidBodies[i];
		body->setHitFraction(1.f);

		if (body->isActive() && (!body->isStaticOrKinematicObject()))
		{

			body->predictIntegratedTransform(timeStep, predictedTrans);

			btScalar squareMotion = (predictedTrans.getOrigin()-body->getWorldTransform().getOrigin()).length2();



			if (getDispatchInfo().m_useContinuous && body->getCcdSquareMotionThreshold() && body->getCcdSquareMotionThreshold() < squareMotion)
			{
				BT_PROFILE("CCD motion clamping");
				if (body->getCollisionShape()->isConvex())
				{
					gNumClampedCcdMotions++;
#ifdef USE_STATIC_ONLY
					class StaticOnlyCallback : public btClosestNotMeConvexResultCallback
					{
					public:

						StaticOnlyCallback (btCollisionObject* me,const btVector3& fromA,const btVector3& toA,btOverlappingPairCache* pairCache,btDispatcher* dispatcher) :
						  btClosestNotMeConvexResultCallback(me,fromA,toA,pairCache,dispatcher)
						{
						}

					  	virtual bool needsCollision(btBroadphaseProxy* proxy0) const
						{
							btCollisionObject* otherObj = (btCollisionObject*) proxy0->m_clientObject;
							if (!otherObj->isStaticOrKinematicObject())
								return false;
							return btClosestNotMeConvexResultCallback::needsCollision(proxy0);
						}
					};

					StaticOnlyCallback sweepResults(body,body->getWorldTransform().getOrigin(),predictedTrans.getOrigin(),getBroadphase()->getOverlappingPairCache(),getDispatcher());
#else
					btClosestNotMeConvexResultCallback sweepResults(body,body->getWorldTransform().getOrigin(),predictedTrans.getOrigin(),getBroadphase()->getOverlappingPairCache(),getDispatcher());
#endif
					//btConvexShape* convexShape = static_cast<btConvexShape*>(body->getCollisionShape());
					btSphereShape tmpSphere(body->getCcdSweptSphereRadius());//btConvexShape* convexShape = static_cast<btConvexShape*>(body->getCollisionShape());
					sweepResults.m_allowedPenetration=getDispatchInfo().m_allowedCcdPenetration;

					sweepResults.m_collisionFilterGroup = body->getBroadphaseProxy()->m_collisionFilterGroup;
					sweepResults.m_collisionFilterMask  = body->getBroadphaseProxy()->m_collisionFilterMask;
					btTransform modifiedPredictedTrans = predictedTrans;
					modifiedPredictedTrans.setBasis(body->getWorldTransform().getBasis());

					convexSweepTest(&tmpSphere,body->getWorldTransform(),modifiedPredictedTrans,sweepResults);
					if (sweepResults.hasHit() && (sweepResults.m_closestHitFraction < 1.f))
					{

						//printf("clamped integration to hit fraction = %f\n",fraction);
						body->setHitFraction(sweepResults.m_closestHitFraction);
						body->predictIntegratedTransform(timeStep*body->getHitFraction(), predictedTrans);
						body->setHitFraction(0.f);
						body->proceedToTransform( predictedTrans);

#if 0
						btVector3 linVel = body->getLinearVelocity();

						btScalar maxSpeed = body->getCcdMotionThreshold()/getSolverInfo().m_timeStep;
						btScalar maxSpeedSqr = maxSpeed*maxSpeed;
						if (linVel.length2()>maxSpeedSqr)
						{
							linVel.normalize();
							linVel*= maxSpeed;
							body->setLinearVelocity(linVel);
							btScalar ms2 = body->getLinearVelocity().length2();
							body->predictIntegratedTransform(timeStep, predictedTrans);

							btScalar sm2 = (predictedTrans.getOrigin()-body->getWorldTransform().getOrigin()).length2();
							btScalar smt = body->getCcdSquareMotionThreshold();
							printf("sm2=%f\n",sm2);
						}
#else

						//don't apply the collision response right now, it will happen next frame
						//if you really need to, you can uncomment next 3 lines. Note that is uses zero restitution.
						//btScalar appliedImpulse = 0.f;
						//btScalar depth = 0.f;
						//appliedImpulse = resolveSingleCollision(body,(btCollisionObject*)sweepResults.m_hitCollisionObject,sweepResults.m_hitPointWorld,sweepResults.m_hitNormalWorld,getSolverInfo(), depth);


#endif

        				continue;
					}
				}
			}


			body->proceedToTransform( predictedTrans);

		}

	}

	///this should probably be switched on by default, but it is not well tested yet
	if (m_applySpeculativeContactRestitution)
	{
		BT_PROFILE("apply speculative contact restitution");
		for (int i=0;i<m_predictiveManifolds.size();i++)
		{
			btPersistentManifold* manifold = m_predictiveManifolds[i];
			btRigidBody* body0 = btRigidBody::upcast((btCollisionObject*)manifold->getBody0());
			btRigidBody* body1 = btRigidBody::upcast((btCollisionObject*)manifold->getBody1());

			for (int p=0;p<manifold->getNumContacts();p++)
			{
				const btManifoldPoint& pt = manifold->getContactPoint(p);
				btScalar combinedRestitution = btManifoldResult::calculateCombinedRestitution(body0, body1);

				if (combinedRestitution>0 && pt.m_appliedImpulse != 0.f)
				//if (pt.getDistance()>0 && combinedRestitution>0 && pt.m_appliedImpulse != 0.f)
				{
					btVector3 imp = -pt.m_normalWorldOnB * pt.m_appliedImpulse* combinedRestitution;

					const btVector3& pos1 = pt.getPositionWorldOnA();
					const btVector3& pos2 = pt.getPositionWorldOnB();

					btVector3 rel_pos0 = pos1 - body0->getWorldTransform().getOrigin();
					btVector3 rel_pos1 = pos2 - body1->getWorldTransform().getOrigin();

					if (body0)
						body0->applyImpulse(imp,rel_pos0);
					if (body1)
						body1->applyImpulse(-imp,rel_pos1);
				}
			}
		}
	}

}